

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O3

void __thiscall
pbrt::FilmBaseParameters::FilmBaseParameters
          (FilmBaseParameters *this,ParameterDictionary *parameters,FilterHandle *filter,
          PixelSensor *sensor,FileLoc *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  Tuple2<pbrt::Point2,_int> TVar8;
  Tuple2<pbrt::Point2,_int> TVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  Tuple2<pbrt::Point2,_int> TVar14;
  int iVar15;
  int iVar16;
  Tuple2<pbrt::Point2,_int> TVar17;
  Tuple2<pbrt::Point2,_int> TVar18;
  int iVar19;
  ulong uVar20;
  Tuple2<pbrt::Point2,_int> TVar21;
  int iVar22;
  Tuple2<pbrt::Point2,_int> TVar23;
  Tuple2<pbrt::Point2,_int> TVar24;
  Tuple2<pbrt::Point2,_int> TVar25;
  Tuple2<pbrt::Point2,_int> TVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  uint uVar29;
  float fVar30;
  Float FVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  vector<int,_std::allocator<int>_> pb;
  vector<float,_std::allocator<float>_> cr;
  string local_b0;
  FileLoc *local_90;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  string local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  int local_34;
  
  local_68 = &this->filename;
  paVar1 = &local_88.field_2;
  (this->fullResolution).super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)0x0;
  (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int> =
       (Tuple2<pbrt::Point2,_int>)0x7fffffff7fffffff;
  (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int> =
       (Tuple2<pbrt::Point2,_int>)0x8000000080000000;
  (this->filter).
  super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
  .bits = 0;
  (this->filter).
  super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
  .bits = (filter->
          super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
          ).bits;
  this->sensor = sensor;
  local_40 = &(this->filename).field_2;
  (this->filename)._M_dataplus._M_p = (pointer)local_40;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  local_90 = loc;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"filename","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
  ParameterDictionary::GetOneString(&local_b0,parameters,&local_88,&local_60);
  std::__cxx11::string::operator=((string *)local_68,(string *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  sVar3 = (this->filename)._M_string_length;
  if (*(long *)(Options + 0x30) == 0) {
    if (sVar3 == 0) {
      std::__cxx11::string::_M_replace((ulong)local_68,0,(char *)0x0,0x291ca3d);
    }
  }
  else {
    if (sVar3 != 0) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      local_b0._M_string_length = 0;
      local_b0.field_2._M_local_buf[0] = '\0';
      detail::stringPrintfRecursive<std::__cxx11::string&,std::__cxx11::string&>
                (&local_b0,
                 "Output filename supplied on command line, \"%s\" will override filename provided in scene description file, \"%s\"."
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (Options + 0x28),local_68);
      Warning(local_90,local_b0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,
                        CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                 local_b0.field_2._M_local_buf[0]) + 1);
      }
    }
    std::__cxx11::string::_M_assign((string *)local_68);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"xresolution","");
  iVar5 = ParameterDictionary::GetOneInt(parameters,&local_b0,0x500);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"yresolution","");
  iVar6 = ParameterDictionary::GetOneInt(parameters,&local_88,0x2d0);
  TVar14.y = iVar6;
  TVar14.x = iVar5;
  (this->fullResolution).super_Tuple2<pbrt::Point2,_int> = TVar14;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  uVar29 = (this->fullResolution).super_Tuple2<pbrt::Point2,_int>.x;
  if (*(char *)(Options + 8) == '\0') {
    uVar11 = (this->fullResolution).super_Tuple2<pbrt::Point2,_int>.y;
  }
  else {
    auVar27 = vpinsrd_avx(ZEXT416(uVar29),(this->fullResolution).super_Tuple2<pbrt::Point2,_int>.y,1
                         );
    auVar32 = vpsrad_avx(auVar27,0x1f);
    auVar32 = vpsrld_avx(auVar32,0x1e);
    auVar27 = vpaddd_avx(auVar27,auVar32);
    auVar32 = vpsrad_avx(auVar27,2);
    auVar27._8_4_ = 1;
    auVar27._0_8_ = 0x100000001;
    auVar27._12_4_ = 1;
    auVar27 = vpmaxsd_avx512vl(auVar32,auVar27);
    uVar29 = auVar27._0_4_;
    uVar11 = auVar27._4_4_;
    (this->fullResolution).super_Tuple2<pbrt::Point2,_int> = auVar27._0_8_;
  }
  TVar17.x = (int)uVar29 >> 0x1f & uVar29;
  TVar17.y = (int)uVar11 >> 0x1f & uVar11;
  uVar20 = 0;
  uVar7 = (ulong)uVar29;
  if ((int)uVar29 < 1) {
    uVar7 = uVar20;
  }
  (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int> = TVar17;
  if (0 < (int)uVar11) {
    uVar20 = (ulong)uVar11;
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int> =
       (Tuple2<pbrt::Point2,_int>)(uVar7 | uVar20 << 0x20);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"pixelbounds","");
  ParameterDictionary::GetIntArray
            ((vector<int,_std::allocator<int>_> *)&local_88,parameters,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  if (*(char *)(Options + 0xec) != '\x01') {
    if (local_88._M_dataplus._M_p == (pointer)local_88._M_string_length) goto LAB_0039e861;
    if (local_88._M_string_length - (long)local_88._M_dataplus._M_p != 0x10) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      local_b0._M_string_length = 0;
      local_60._M_dataplus._M_p._0_4_ =
           (int)(local_88._M_string_length - (long)local_88._M_dataplus._M_p >> 2);
      local_b0.field_2._M_local_buf[0] = '\0';
      detail::stringPrintfRecursive<int>
                (&local_b0,"%d values supplied for \"pixelbounds\". Expected 4.",(int *)&local_60);
      Error(local_90,local_b0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,
                        CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                 local_b0.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_0039e861;
    }
    iVar5 = *(int *)local_88._M_dataplus._M_p;
    iVar6 = *(int *)(local_88._M_dataplus._M_p + 4);
    iVar12 = *(int *)(local_88._M_dataplus._M_p + 8);
    iVar16 = *(int *)(local_88._M_dataplus._M_p + 0xc);
    iVar13 = (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>.x;
    iVar22 = iVar5;
    if (iVar6 < iVar5) {
      iVar22 = iVar6;
    }
    iVar19 = iVar12;
    if (iVar16 < iVar12) {
      iVar19 = iVar16;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar16 < iVar12) {
      iVar16 = iVar12;
    }
    iVar5 = (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>.y;
    if (iVar19 < iVar5 || iVar22 < iVar13) {
LAB_0039e7b5:
      Warning(local_90,"Supplied pixel bounds extend beyond image resolution. Clamping.");
      iVar13 = (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>.x;
      iVar5 = (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>.y;
      iVar12 = (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>.x;
      iVar15 = (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>.y;
    }
    else {
      iVar12 = (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>.x;
      iVar15 = (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>.y;
      if (iVar15 < iVar16 || iVar12 < iVar6) goto LAB_0039e7b5;
    }
    if (iVar13 < iVar22) {
      iVar13 = iVar22;
    }
    if (iVar5 < iVar19) {
      iVar5 = iVar19;
    }
    TVar9.y = iVar5;
    TVar9.x = iVar13;
    if (iVar12 < iVar6) {
      iVar6 = iVar12;
    }
    (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int> = TVar9;
    if (iVar15 < iVar16) {
      iVar16 = iVar15;
    }
    TVar26.y = iVar16;
    TVar26.x = iVar6;
    (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int> = TVar26;
    goto LAB_0039e861;
  }
  iVar5 = *(int *)(Options + 0xdc);
  iVar6 = *(int *)(Options + 0xe0);
  iVar12 = *(int *)(Options + 0xe4);
  iVar16 = *(int *)(Options + 0xe8);
  iVar13 = (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>.x;
  iVar22 = (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>.y;
  if (iVar6 < iVar22 || iVar5 < iVar13) {
LAB_0039e6bf:
    Warning(local_90,"Supplied pixel bounds extend beyond image resolution. Clamping.");
    iVar13 = (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>.x;
    iVar22 = (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>.y;
    iVar19 = (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>.x;
    iVar15 = (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>.y;
  }
  else {
    iVar19 = (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>.x;
    iVar15 = (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>.y;
    if (iVar15 < iVar16 || iVar19 < iVar12) goto LAB_0039e6bf;
  }
  if (iVar13 < iVar5) {
    iVar13 = iVar5;
  }
  if (iVar22 < iVar6) {
    iVar22 = iVar6;
  }
  TVar8.y = iVar22;
  TVar8.x = iVar13;
  if (iVar19 < iVar12) {
    iVar12 = iVar19;
  }
  (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int> = TVar8;
  if (iVar15 < iVar16) {
    iVar16 = iVar15;
  }
  TVar25.y = iVar16;
  TVar25.x = iVar12;
  (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int> = TVar25;
  if (local_88._M_dataplus._M_p != (pointer)local_88._M_string_length) {
    Warning(local_90,"Both pixel bounds and crop window were specified. Using the crop window.");
  }
LAB_0039e861:
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"cropwindow","");
  ParameterDictionary::GetFloatArray
            ((vector<float,_std::allocator<float>_> *)&local_60,parameters,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  lVar10 = Options;
  if (*(char *)(Options + 0xd8) == '\x01') {
    fVar30 = (float)(this->fullResolution).super_Tuple2<pbrt::Point2,_int>.x;
    fVar35 = (float)(this->fullResolution).super_Tuple2<pbrt::Point2,_int>.y;
    auVar27 = ZEXT416((uint)(fVar30 * *(float *)(Options + 200)));
    auVar27 = vroundss_avx(auVar27,auVar27,10);
    auVar32 = ZEXT416((uint)(fVar35 * *(float *)(Options + 0xcc)));
    auVar32 = vroundss_avx(auVar32,auVar32,10);
    iVar12 = (int)auVar27._0_4_;
    iVar16 = (int)auVar32._0_4_;
    auVar27 = ZEXT416((uint)(fVar30 * *(float *)(Options + 0xd0)));
    auVar27 = vroundss_avx(auVar27,auVar27,10);
    iVar6 = (int)auVar27._0_4_;
    iVar5 = iVar12;
    if (iVar6 < iVar12) {
      iVar5 = iVar6;
    }
    auVar27 = ZEXT416((uint)(fVar35 * *(float *)(Options + 0xd4)));
    auVar27 = vroundss_avx(auVar27,auVar27,10);
    iVar22 = (int)auVar27._0_4_;
    iVar13 = iVar16;
    if (iVar22 < iVar16) {
      iVar13 = iVar22;
    }
    TVar24.y = iVar13;
    TVar24.x = iVar5;
    if (iVar6 < iVar12) {
      iVar6 = iVar12;
    }
    (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int> = TVar24;
    if (iVar22 < iVar16) {
      iVar22 = iVar16;
    }
    TVar21.y = iVar22;
    TVar21.x = iVar6;
    (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int> = TVar21;
    if (local_60._M_dataplus._M_p != (pointer)local_60._M_string_length) {
      Warning(local_90,
              "Crop window supplied on command line will override crop window specified with Film.")
      ;
      lVar10 = Options;
    }
    if ((*(char *)(lVar10 + 0xec) != '\0') ||
       (local_88._M_dataplus._M_p != (pointer)local_88._M_string_length)) {
      Warning(local_90,"Both pixel bounds and crop window were specified. Using the crop window.");
    }
  }
  else if (local_60._M_dataplus._M_p != (pointer)local_60._M_string_length) {
    if (*(char *)(Options + 0xec) == '\x01') {
      Warning(local_90,
              "Ignoring \"cropwindow\" since pixel bounds were specified on the command line.");
    }
    else if (local_60._M_string_length - (long)local_60._M_dataplus._M_p == 0x10) {
      if (local_88._M_dataplus._M_p != (pointer)local_88._M_string_length) {
        Warning(local_90,"Both pixel bounds and crop window were specified. Using the crop window.")
        ;
      }
      aVar2 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_60._M_dataplus._M_p;
      auVar27 = vshufps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0xb1);
      uVar7 = vcmpps_avx512vl((undefined1  [16])aVar2,auVar27,1);
      auVar27 = vmovsldup_avx((undefined1  [16])aVar2);
      auVar32 = vmovshdup_avx512vl((undefined1  [16])aVar2);
      bVar4 = (bool)((byte)uVar7 & 1);
      auVar28._0_4_ = (uint)bVar4 * auVar32._0_4_ | (uint)!bVar4 * auVar27._0_4_;
      bVar4 = (bool)((byte)(uVar7 >> 1) & 1);
      auVar28._4_4_ = (uint)bVar4 * auVar32._4_4_ | (uint)!bVar4 * auVar27._4_4_;
      bVar4 = (bool)((byte)(uVar7 >> 2) & 1);
      auVar28._8_4_ = (uint)bVar4 * auVar32._8_4_ | (uint)!bVar4 * auVar27._8_4_;
      bVar4 = (bool)((byte)(uVar7 >> 3) & 1);
      auVar28._12_4_ = (uint)bVar4 * auVar32._12_4_ | (uint)!bVar4 * auVar27._12_4_;
      uVar7 = vcmpps_avx512vl(auVar28,ZEXT816(0) << 0x40,1);
      auVar32 = vmovshdup_avx(auVar28);
      auVar33 = vshufps_avx(auVar28,auVar28,0xff);
      auVar34 = SUB6416(ZEXT464(0x3f800000),0);
      auVar27 = vminss_avx(auVar34,auVar28);
      auVar28 = vshufpd_avx(auVar28,auVar28,1);
      auVar32 = vminss_avx(auVar34,auVar32);
      auVar33 = vminss_avx(auVar34,auVar33);
      auVar28 = vminss_avx(auVar34,auVar28);
      fVar35 = (float)(this->fullResolution).super_Tuple2<pbrt::Point2,_int>.x;
      auVar32 = ZEXT416((uint)((float)((uint)!(bool)((byte)(uVar7 >> 1) & 1) * auVar32._0_4_) *
                              fVar35));
      auVar32 = vroundss_avx(auVar32,auVar32,10);
      iVar16 = (int)auVar32._0_4_;
      fVar30 = (float)(this->fullResolution).super_Tuple2<pbrt::Point2,_int>.y;
      auVar27 = ZEXT416((uint)((float)((uint)!(bool)((byte)uVar7 & 1) * auVar27._0_4_) * fVar35));
      auVar27 = vroundss_avx(auVar27,auVar27,10);
      auVar32 = ZEXT416((uint)((float)((uint)!(bool)((byte)(uVar7 >> 3) & 1) * auVar33._0_4_) *
                              fVar30));
      auVar32 = vroundss_avx(auVar32,auVar32,10);
      iVar6 = (int)auVar27._0_4_;
      auVar27 = ZEXT416((uint)((float)((uint)!(bool)((byte)(uVar7 >> 2) & 1) * auVar28._0_4_) *
                              fVar30));
      auVar27 = vroundss_avx(auVar27,auVar27,10);
      iVar13 = (int)auVar32._0_4_;
      iVar12 = (int)auVar27._0_4_;
      iVar5 = iVar16;
      if (iVar6 < iVar16) {
        iVar5 = iVar6;
      }
      iVar22 = iVar13;
      if (iVar12 < iVar13) {
        iVar22 = iVar12;
      }
      TVar23.y = iVar22;
      TVar23.x = iVar5;
      if (iVar6 < iVar16) {
        iVar6 = iVar16;
      }
      (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int> = TVar23;
      if (iVar12 < iVar13) {
        iVar12 = iVar13;
      }
      TVar18.y = iVar12;
      TVar18.x = iVar6;
      (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int> = TVar18;
    }
    else {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      local_b0._M_string_length = 0;
      local_34 = (int)(local_60._M_string_length - (long)local_60._M_dataplus._M_p >> 2);
      local_b0.field_2._M_local_buf[0] = '\0';
      detail::stringPrintfRecursive<int>
                (&local_b0,"%d values supplied for \"cropwindow\". Expected 4.",&local_34);
      Error(local_90,local_b0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,
                        CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                 local_b0.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  auVar32._8_8_ = 0;
  auVar32._0_8_ = (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>;
  uVar7 = vpcmpd_avx512vl(auVar32,auVar33,5);
  if ((uVar7 & 3) != 0) {
    ErrorExit<pbrt::Bounds2<int>&>
              (local_90,"Degenerate pixel bounds provided to film: %s.",&this->pixelBounds);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"diagonal","");
  FVar31 = ParameterDictionary::GetOneFloat(parameters,&local_b0,35.0);
  this->diagonal = FVar31;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_60._M_dataplus._M_p,
                    local_60.field_2._M_allocated_capacity - (long)local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_88._M_dataplus._M_p,
                    local_88.field_2._M_allocated_capacity - (long)local_88._M_dataplus._M_p);
  }
  return;
}

Assistant:

FilmBaseParameters::FilmBaseParameters(const ParameterDictionary &parameters,
                                       FilterHandle filter, const PixelSensor *sensor,
                                       const FileLoc *loc)
    : filter(filter), sensor(sensor) {
    filename = parameters.GetOneString("filename", "");
    if (!Options->imageFile.empty()) {
        if (!filename.empty())
            Warning(loc,
                    "Output filename supplied on command line, \"%s\" will "
                    "override "
                    "filename provided in scene description file, \"%s\".",
                    Options->imageFile, filename);
        filename = Options->imageFile;
    } else if (filename.empty())
        filename = "pbrt.exr";

    fullResolution = Point2i(parameters.GetOneInt("xresolution", 1280),
                             parameters.GetOneInt("yresolution", 720));
    if (Options->quickRender) {
        fullResolution.x = std::max(1, fullResolution.x / 4);
        fullResolution.y = std::max(1, fullResolution.y / 4);
    }

    pixelBounds = Bounds2i(Point2i(0, 0), fullResolution);
    std::vector<int> pb = parameters.GetIntArray("pixelbounds");
    if (Options->pixelBounds) {
        Bounds2i newBounds = *Options->pixelBounds;
        if (Intersect(newBounds, pixelBounds) != newBounds)
            Warning(loc, "Supplied pixel bounds extend beyond image "
                         "resolution. Clamping.");
        pixelBounds = Intersect(newBounds, pixelBounds);

        if (!pb.empty())
            Warning(loc, "Both pixel bounds and crop window were specified. Using the "
                         "crop window.");
    } else if (!pb.empty()) {
        if (pb.size() != 4)
            Error(loc, "%d values supplied for \"pixelbounds\". Expected 4.",
                  int(pb.size()));
        else {
            Bounds2i newBounds = Bounds2i({pb[0], pb[2]}, {pb[1], pb[3]});
            if (Intersect(newBounds, pixelBounds) != newBounds)
                Warning(loc, "Supplied pixel bounds extend beyond image "
                             "resolution. Clamping.");
            pixelBounds = Intersect(newBounds, pixelBounds);
        }
    }

    std::vector<Float> cr = parameters.GetFloatArray("cropwindow");
    if (Options->cropWindow) {
        Bounds2f crop = *Options->cropWindow;
        // Compute film image bounds
        pixelBounds = Bounds2i(Point2i(std::ceil(fullResolution.x * crop.pMin.x),
                                       std::ceil(fullResolution.y * crop.pMin.y)),
                               Point2i(std::ceil(fullResolution.x * crop.pMax.x),
                                       std::ceil(fullResolution.y * crop.pMax.y)));

        if (!cr.empty())
            Warning(loc, "Crop window supplied on command line will override "
                         "crop window specified with Film.");
        if (Options->pixelBounds || !pb.empty())
            Warning(loc, "Both pixel bounds and crop window were specified. Using the "
                         "crop window.");
    } else if (!cr.empty()) {
        if (Options->pixelBounds)
            Warning(loc, "Ignoring \"cropwindow\" since pixel bounds were specified "
                         "on the command line.");
        else if (cr.size() == 4) {
            if (!pb.empty())
                Warning(loc, "Both pixel bounds and crop window were "
                             "specified. Using the "
                             "crop window.");

            Bounds2f crop;
            crop.pMin.x = Clamp(std::min(cr[0], cr[1]), 0.f, 1.f);
            crop.pMax.x = Clamp(std::max(cr[0], cr[1]), 0.f, 1.f);
            crop.pMin.y = Clamp(std::min(cr[2], cr[3]), 0.f, 1.f);
            crop.pMax.y = Clamp(std::max(cr[2], cr[3]), 0.f, 1.f);

            // Compute film image bounds
            pixelBounds = Bounds2i(Point2i(std::ceil(fullResolution.x * crop.pMin.x),
                                           std::ceil(fullResolution.y * crop.pMin.y)),
                                   Point2i(std::ceil(fullResolution.x * crop.pMax.x),
                                           std::ceil(fullResolution.y * crop.pMax.y)));
        } else
            Error(loc, "%d values supplied for \"cropwindow\". Expected 4.",
                  (int)cr.size());
    }

    if (pixelBounds.IsEmpty())
        ErrorExit(loc, "Degenerate pixel bounds provided to film: %s.", pixelBounds);

    diagonal = parameters.GetOneFloat("diagonal", 35.);
}